

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::UninterpretedOption::_InternalSerialize
          (UninterpretedOption *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  UninterpretedOption *pUVar1;
  bool bVar2;
  int iVar3;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *this_00;
  const_reference this_01;
  uint32_t *puVar4;
  char *pcVar5;
  uint64_t value;
  int64_t value_00;
  UnknownFieldSet *unknown_fields;
  double value_01;
  string_view sVar6;
  string_view local_98;
  string *local_88;
  string *_s_2;
  char *local_78;
  string *local_70;
  string *_s_1;
  char *local_60;
  string_view local_58;
  string *local_48;
  string *_s;
  UninterpretedOption_NamePart *repfield;
  uint local_30;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  UninterpretedOption *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  UninterpretedOption *this_local;
  
  n = 0;
  local_30 = 0;
  _i = this;
  this_ = (UninterpretedOption *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  repfield._4_4_ = _internal_name_size(this);
  for (; local_30 < repfield._4_4_; local_30 = local_30 + 1) {
    this_00 = _internal_name(_i);
    this_01 = RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::Get
                        (this_00,local_30);
    _s = (string *)this_01;
    iVar3 = UninterpretedOption_NamePart::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)this_01,iVar3,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  puVar4 = internal::HasBits<1>::operator[](&(_i->field_0)._impl_._has_bits_,0);
  n = *puVar4;
  if ((n & 1) != 0) {
    local_48 = _internal_identifier_value_abi_cxx11_(_i);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_58,"google.protobuf.UninterpretedOption.identifier_value");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar3,SERIALIZE,local_58);
    pUVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
    local_60 = sVar6._M_str;
    _s_1 = (string *)sVar6._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pUVar1,3,sVar6,(uint8_t *)stream_local);
  }
  if ((n & 8) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    value = _internal_positive_int_value(_i);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteUInt64ToArray(4,value,(uint8_t *)stream_local);
  }
  pUVar1 = this_;
  if ((n & 0x10) != 0) {
    value_00 = _internal_negative_int_value(_i);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteInt64ToArrayWithField<5>
                             ((EpsCopyOutputStream *)pUVar1,value_00,(uint8_t *)stream_local);
  }
  if ((n & 0x20) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    value_01 = _internal_double_value(_i);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteDoubleToArray(6,value_01,(uint8_t *)stream_local);
  }
  if ((n & 2) != 0) {
    local_70 = _internal_string_value_abi_cxx11_(_i);
    pUVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
    local_78 = sVar6._M_str;
    _s_2 = (string *)sVar6._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteBytesMaybeAliased
                             ((EpsCopyOutputStream *)pUVar1,7,sVar6,(uint8_t *)stream_local);
  }
  if ((n & 4) != 0) {
    local_88 = _internal_aggregate_value_abi_cxx11_(_i);
    pcVar5 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_98,"google.protobuf.UninterpretedOption.aggregate_value");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar5,iVar3,SERIALIZE,local_98);
    pUVar1 = this_;
    sVar6 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pUVar1,8,sVar6,(uint8_t *)stream_local);
  }
  bVar2 = internal::InternalMetadata::have_unknown_fields
                    (&(_i->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(_i->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL UninterpretedOption::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const UninterpretedOption& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.UninterpretedOption)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_name_size());
       i < n; i++) {
    const auto& repfield = this_._internal_name().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string identifier_value = 3;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_identifier_value();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.UninterpretedOption.identifier_value");
    target = stream->WriteStringMaybeAliased(3, _s, target);
  }

  // optional uint64 positive_int_value = 4;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt64ToArray(
        4, this_._internal_positive_int_value(), target);
  }

  // optional int64 negative_int_value = 5;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<5>(
            stream, this_._internal_negative_int_value(), target);
  }

  // optional double double_value = 6;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteDoubleToArray(
        6, this_._internal_double_value(), target);
  }

  // optional bytes string_value = 7;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_string_value();
    target = stream->WriteBytesMaybeAliased(7, _s, target);
  }

  // optional string aggregate_value = 8;
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_aggregate_value();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.UninterpretedOption.aggregate_value");
    target = stream->WriteStringMaybeAliased(8, _s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.UninterpretedOption)
  return target;
}